

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::WriteStackVarDeclarations(CWriter *this)

{
  bool bVar1;
  Enum EVar2;
  Enum EVar3;
  reference __in;
  type *ptVar4;
  string_view s;
  Newline local_c9;
  string_view local_c8;
  string_view local_b0;
  Type local_a0;
  Type stp_type;
  type *name;
  type *pair;
  _Self local_80;
  iterator __end3;
  iterator __begin3;
  StackVarSymbolMap *__range3;
  size_t count;
  Type type;
  const_iterator __end2;
  const_iterator __begin2;
  undefined8 local_3c;
  undefined8 local_34;
  undefined4 local_2c;
  initializer_list<wabt::Type::Enum> local_28;
  initializer_list<wabt::Type::Enum> *local_18;
  initializer_list<wabt::Type::Enum> *__range2;
  CWriter *this_local;
  
  stack0xffffffffffffffbc = 0xfffffffeffffffff;
  local_3c = 0xfffffffcfffffffd;
  local_34 = 0xfffffff0fffffffb;
  local_2c = 0xffffffef;
  local_28._M_array = (iterator)((long)&__begin2 + 4);
  local_28._M_len = 7;
  local_18 = &local_28;
  __range2 = (initializer_list<wabt::Type::Enum> *)this;
  __end2 = std::initializer_list<wabt::Type::Enum>::begin(local_18);
  type = (Type)std::initializer_list<wabt::Type::Enum>::end(local_18);
  for (; (Type)__end2 != type; __end2 = __end2 + 1) {
    Type::Type((Type *)&count,*__end2);
    __range3 = (StackVarSymbolMap *)0x0;
    __end3 = std::
             map<std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<unsigned_int,_wabt::Type>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(&this->stack_var_sym_map_);
    local_80._M_node =
         (_Base_ptr)
         std::
         map<std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<unsigned_int,_wabt::Type>_>,_std::allocator<std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end(&this->stack_var_sym_map_);
    while( true ) {
      bVar1 = std::operator!=(&__end3,&local_80);
      if (!bVar1) break;
      __in = std::
             _Rb_tree_iterator<std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(&__end3);
      ptVar4 = std::get<0ul,std::pair<unsigned_int,wabt::Type>const,std::__cxx11::string>(__in);
      stp_type = (Type)std::get<1ul,std::pair<unsigned_int,wabt::Type>const,std::__cxx11::string>
                                 (__in);
      local_a0 = ptVar4->second;
      EVar2 = Type::operator_cast_to_Enum(&local_a0);
      EVar3 = Type::operator_cast_to_Enum((Type *)&count);
      if (EVar2 == EVar3) {
        if (__range3 == (StackVarSymbolMap *)0x0) {
          (anonymous_namespace)::CWriter::Write<wabt::Type&,char_const(&)[2]>
                    ((CWriter *)this,(Type *)&count,(char (*) [2])0x353a7b);
          Indent(this,4);
        }
        else {
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_b0,", ");
          Write(this,local_b0);
          if (((ulong)__range3 & 7) == 0) {
            Write(this);
          }
        }
        s = (string_view)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)stp_type);
        local_c8 = s;
        Write(this,s);
        __range3 = (StackVarSymbolMap *)&(__range3->_M_t)._M_impl.field_0x1;
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::pair<unsigned_int,_wabt::Type>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end3);
    }
    if (__range3 != (StackVarSymbolMap *)0x0) {
      Dedent(this,4);
      (anonymous_namespace)::CWriter::Write<char_const(&)[2],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(char (*) [2])0x361b67,&local_c9);
    }
  }
  return;
}

Assistant:

void CWriter::WriteStackVarDeclarations() {
  for (Type type : {Type::I32, Type::I64, Type::F32, Type::F64, Type::V128,
                    Type::FuncRef, Type::ExternRef}) {
    size_t count = 0;
    for (const auto& [pair, name] : stack_var_sym_map_) {
      Type stp_type = pair.second;

      if (stp_type == type) {
        if (count == 0) {
          Write(type, " ");
          Indent(4);
        } else {
          Write(", ");
          if ((count % 8) == 0)
            Write(Newline());
        }

        Write(name);
        ++count;
      }
    }
    if (count != 0) {
      Dedent(4);
      Write(";", Newline());
    }
  }
}